

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetF0CandidateContourSub
               (double **interpolated_f0_set,int f0_length,double f0_floor,double f0_ceil,
               double boundary_f0,double *f0_candidate,double *f0_score)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  int i;
  int local_3c;
  
  for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
    *(double *)(in_RDX + (long)local_3c * 8) =
         (*(double *)(*in_RDI + (long)local_3c * 8) + *(double *)(in_RDI[1] + (long)local_3c * 8) +
          *(double *)(in_RDI[2] + (long)local_3c * 8) + *(double *)(in_RDI[3] + (long)local_3c * 8))
         / 4.0;
    dVar1 = sqrt(((*(double *)(in_RDI[3] + (long)local_3c * 8) -
                  *(double *)(in_RDX + (long)local_3c * 8)) *
                  (*(double *)(in_RDI[3] + (long)local_3c * 8) -
                  *(double *)(in_RDX + (long)local_3c * 8)) +
                 (*(double *)(in_RDI[2] + (long)local_3c * 8) -
                 *(double *)(in_RDX + (long)local_3c * 8)) *
                 (*(double *)(in_RDI[2] + (long)local_3c * 8) -
                 *(double *)(in_RDX + (long)local_3c * 8)) +
                 (*(double *)(*in_RDI + (long)local_3c * 8) -
                 *(double *)(in_RDX + (long)local_3c * 8)) *
                 (*(double *)(*in_RDI + (long)local_3c * 8) -
                 *(double *)(in_RDX + (long)local_3c * 8)) +
                 (*(double *)(in_RDI[1] + (long)local_3c * 8) -
                 *(double *)(in_RDX + (long)local_3c * 8)) *
                 (*(double *)(in_RDI[1] + (long)local_3c * 8) -
                 *(double *)(in_RDX + (long)local_3c * 8))) / 3.0);
    *(double *)(in_RCX + (long)local_3c * 8) = dVar1;
    if ((((in_XMM2_Qa < *(double *)(in_RDX + (long)local_3c * 8)) ||
         (*(double *)(in_RDX + (long)local_3c * 8) < in_XMM2_Qa / 2.0)) ||
        (in_XMM1_Qa < *(double *)(in_RDX + (long)local_3c * 8))) ||
       (*(double *)(in_RDX + (long)local_3c * 8) < in_XMM0_Qa)) {
      *(undefined8 *)(in_RDX + (long)local_3c * 8) = 0;
      *(undefined8 *)(in_RCX + (long)local_3c * 8) = 0x40f86a0000000000;
    }
  }
  return;
}

Assistant:

static void GetF0CandidateContourSub(
    const double * const * interpolated_f0_set, int f0_length, double f0_floor,
    double f0_ceil, double boundary_f0, double *f0_candidate,
    double *f0_score) {
  for (int i = 0; i < f0_length; ++i) {
    f0_candidate[i] = (interpolated_f0_set[0][i] +
      interpolated_f0_set[1][i] + interpolated_f0_set[2][i] +
      interpolated_f0_set[3][i]) / 4.0;

    f0_score[i] = sqrt(((interpolated_f0_set[0][i] - f0_candidate[i]) *
      (interpolated_f0_set[0][i] - f0_candidate[i]) +
      (interpolated_f0_set[1][i] - f0_candidate[i]) *
      (interpolated_f0_set[1][i] - f0_candidate[i]) +
      (interpolated_f0_set[2][i] - f0_candidate[i]) *
      (interpolated_f0_set[2][i] - f0_candidate[i]) +
      (interpolated_f0_set[3][i] - f0_candidate[i]) *
      (interpolated_f0_set[3][i] - f0_candidate[i])) / 3.0);

    if (f0_candidate[i] > boundary_f0 || f0_candidate[i] < boundary_f0 / 2.0 ||
        f0_candidate[i] > f0_ceil || f0_candidate[i] < f0_floor) {
      f0_candidate[i] = 0.0;
      f0_score[i] = world::kMaximumValue;
    }
  }
}